

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,char *filename)

{
  char *pcVar1;
  int *piVar2;
  REF_GEOM pRVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  REF_SIZE RVar6;
  int iVar7;
  uint uVar8;
  REF_STATUS RVar9;
  undefined4 uVar10;
  size_t sVar11;
  FILE *pFVar12;
  size_t sVar13;
  FILE *file;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  REF_LONG *pRVar17;
  ulong uVar18;
  undefined8 uVar19;
  REF_GLOB RVar20;
  REF_INT RVar21;
  long lVar22;
  REF_MPI ref_mpi;
  int iVar23;
  ulong uVar24;
  void *__ptr;
  ulong uVar25;
  long lVar26;
  char *pcVar27;
  REF_NODE pRVar28;
  ulong uVar29;
  size_t next_position;
  bool bVar30;
  bool bVar31;
  ulong uStackY_1d0;
  int length;
  char nul;
  REF_MPI pRVar32;
  int local_1a4;
  FILE *local_1a0;
  REF_INT local_194;
  REF_NODE local_190;
  void *local_188;
  char ref_point_desc [1];
  REF_LONG ntri;
  char mesh_name [16];
  char coordinate_system [7];
  char mesh_units [12];
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_LONG ntet;
  REF_GLOB *l2c;
  undefined6 uStack_120;
  undefined2 uStack_11a;
  undefined6 uStack_118;
  void *local_110;
  long local_108;
  REF_LONG nedg;
  REF_GLOB nnode;
  size_t local_c8;
  ulong local_c0;
  ulong local_b8;
  char file_description [7];
  int refined;
  int precision;
  int n_meshes;
  int revision_number;
  int magic_number;
  char mesh_generator [7];
  char magic_string [7];
  void *local_78;
  char *patch_type;
  char *patch_label;
  char contact_info [12];
  char element_scheme [8];
  double model_scale;
  char mesh_type [8];
  int dimension;
  
  sVar11 = strlen(filename);
  if (sVar11 < 5) goto LAB_0016cfb5;
  pcVar27 = filename + (sVar11 - 4);
  iVar7 = strcmp(pcVar27,".tec");
  if (((iVar7 == 0) || (iVar7 = strcmp(pcVar27,".dat"), iVar7 == 0)) ||
     ((pcVar1 = filename + sVar11, pcVar1[-2] == '.' && ((pcVar1[-1] == 't' && (*pcVar1 == '\0')))))
     ) {
    pRVar28 = ref_grid->node;
    uVar8 = ref_node_synchronize_globals(pRVar28);
    if (uVar8 == 0) {
      if (ref_grid->mpi->id != 0) {
        pFVar12 = (FILE *)0x0;
LAB_0016ca4c:
        pRVar4 = ref_grid->cell[0];
        uVar8 = ref_grid_compact_cell_nodes(ref_grid,pRVar4,&nnode,(REF_LONG *)mesh_name,&l2c);
        if (uVar8 == 0) {
          if ((long)mesh_name._0_8_ < 1 || nnode < 1) {
LAB_0016ce40:
            free(l2c);
            pRVar4 = ref_grid->cell[3];
            uVar8 = ref_grid_compact_cell_nodes(ref_grid,pRVar4,&nnode,(REF_LONG *)mesh_name,&l2c);
            if (uVar8 == 0) {
              if ((long)mesh_name._0_8_ < 1 || nnode < 1) {
LAB_0016d1b0:
                free(l2c);
                pRVar4 = ref_grid->cell[8];
                uVar8 = ref_grid_compact_cell_nodes
                                  (ref_grid,pRVar4,&nnode,(REF_LONG *)mesh_name,&l2c);
                if (uVar8 == 0) {
                  if ((long)mesh_name._0_8_ < 1 || nnode < 1) {
LAB_0016d744:
                    free(l2c);
                    iVar7 = ref_grid->mpi->id;
                    goto joined_r0x0016d758;
                  }
                  if (ref_grid->mpi->id == 0) {
                    fprintf(pFVar12,
                            "zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                            ,nnode,mesh_name._0_8_,"point","fetetrahedron");
                  }
                  uVar8 = ref_gather_node_tec_part
                                    (pRVar28,nnode,l2c,0,(REF_DBL *)0x0,(FILE *)pFVar12);
                  if (uVar8 == 0) {
                    uVar8 = ref_gather_cell_tec(pRVar28,pRVar4,mesh_name._0_8_,l2c,0,(FILE *)pFVar12
                                               );
                    if (uVar8 == 0) goto LAB_0016d744;
                    uStackY_1d0 = (ulong)uVar8;
                    pcVar27 = "nodes";
                    uVar19 = 0x478;
                  }
                  else {
                    uStackY_1d0 = (ulong)uVar8;
                    pcVar27 = "nodes";
                    uVar19 = 0x476;
                  }
                }
                else {
                  uStackY_1d0 = (ulong)uVar8;
                  pcVar27 = "l2c";
                  uVar19 = 0x46d;
                }
              }
              else {
                if (ref_grid->mpi->id == 0) {
                  fprintf(pFVar12,
                          "zone t=\"face\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                          nnode,mesh_name._0_8_,"point","fetriangle");
                }
                uVar8 = ref_gather_node_tec_part(pRVar28,nnode,l2c,0,(REF_DBL *)0x0,(FILE *)pFVar12)
                ;
                if (uVar8 == 0) {
                  uVar8 = ref_gather_cell_tec(pRVar28,pRVar4,mesh_name._0_8_,l2c,0,(FILE *)pFVar12);
                  if (uVar8 == 0) goto LAB_0016d1b0;
                  uStackY_1d0 = (ulong)uVar8;
                  pcVar27 = "nodes";
                  uVar19 = 0x467;
                }
                else {
                  uStackY_1d0 = (ulong)uVar8;
                  pcVar27 = "nodes";
                  uVar19 = 0x465;
                }
              }
            }
            else {
              uStackY_1d0 = (ulong)uVar8;
              pcVar27 = "l2c";
              uVar19 = 0x45c;
            }
          }
          else {
            if (ref_grid->mpi->id == 0) {
              fprintf(pFVar12,
                      "zone t=\"edge\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                      nnode,mesh_name._0_8_,"point","felineseg");
            }
            uVar8 = ref_gather_node_tec_part(pRVar28,nnode,l2c,0,(REF_DBL *)0x0,(FILE *)pFVar12);
            if (uVar8 == 0) {
              uVar8 = ref_gather_cell_tec(pRVar28,pRVar4,mesh_name._0_8_,l2c,0,(FILE *)pFVar12);
              if (uVar8 == 0) goto LAB_0016ce40;
              uStackY_1d0 = (ulong)uVar8;
              pcVar27 = "nodes";
              uVar19 = 0x456;
            }
            else {
              uStackY_1d0 = (ulong)uVar8;
              pcVar27 = "nodes";
              uVar19 = 0x454;
            }
          }
        }
        else {
          uStackY_1d0 = (ulong)uVar8;
          pcVar27 = "l2c";
          uVar19 = 1099;
        }
        goto LAB_0016ca9b;
      }
      pFVar12 = fopen(filename,"w");
      if (pFVar12 != (FILE *)0x0) {
        fwrite("title=\"geometry\"\n",0x11,1,pFVar12);
        fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar12);
        goto LAB_0016ca4c;
      }
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x443,"ref_gather_tec","unable to open file");
      uStackY_1d0 = 2;
    }
    else {
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "sync";
      uVar19 = 0x43d;
LAB_0016ca9b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar19,"ref_gather_tec",uStackY_1d0,pcVar27);
    }
    pcVar27 = "scalar tec";
    uVar19 = 0xb69;
    goto LAB_0016cac6;
  }
  iVar7 = strcmp(pcVar27,".avm");
  if (iVar7 != 0) {
    iVar7 = strcmp(pcVar27,".plt");
    if (iVar7 == 0) {
      uVar8 = ref_gather_scalar_by_extension(ref_grid,0,(REF_DBL *)0x0,(char **)0x0,filename);
      if (uVar8 == 0) {
        return 0;
      }
      pcVar27 = "scalar plt";
      uVar19 = 0xb74;
      goto LAB_0016cd19;
    }
    if (sVar11 < 0xb) {
      if (sVar11 == 10) goto LAB_0016cbc7;
      if (sVar11 < 7) goto LAB_0016cfb5;
    }
    else {
      iVar7 = strcmp(pcVar1 + -10,".lb8.ugrid");
      if (iVar7 == 0) {
        uVar8 = ref_gather_bin_ugrid(ref_grid,filename,0,0);
        if (uVar8 == 0) {
          return 0;
        }
        pcVar27 = ".lb8.ugrid failed";
        uVar19 = 0xb7a;
        goto LAB_0016cd19;
      }
LAB_0016cbc7:
      iVar7 = strcmp(pcVar1 + -9,".b8.ugrid");
      if (iVar7 == 0) {
        uVar8 = ref_gather_bin_ugrid(ref_grid,filename,1,0);
        if (uVar8 == 0) {
          return 0;
        }
        pcVar27 = ".b8.ugrid failed";
        uVar19 = 0xb80;
        goto LAB_0016cd19;
      }
      if (sVar11 < 0xc) {
        if (sVar11 < 0xb) goto LAB_0016cf9e;
      }
      else {
        iVar7 = strcmp(pcVar1 + -0xb,".lb8l.ugrid");
        if (iVar7 == 0) {
          uVar8 = ref_gather_bin_ugrid(ref_grid,filename,0,1);
          if (uVar8 == 0) {
            return 0;
          }
          pcVar27 = ".lb8l.ugrid failed";
          uVar19 = 0xb86;
          goto LAB_0016cd19;
        }
      }
      iVar7 = strcmp(pcVar1 + -10,".b8l.ugrid");
      if (iVar7 == 0) {
        uVar8 = ref_gather_bin_ugrid(ref_grid,filename,1,1);
        if (uVar8 == 0) {
          return 0;
        }
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = ".b8l.ugrid failed";
        uVar19 = 0xb8c;
        goto LAB_0016cac6;
      }
      if (sVar11 < 0xd) {
        if (sVar11 < 0xc) goto LAB_0016cf9e;
      }
      else {
        iVar7 = strcmp(pcVar1 + -0xc,".lb8.ugrid64");
        if (iVar7 == 0) {
          uVar8 = ref_gather_bin_ugrid(ref_grid,filename,0,1);
          if (uVar8 == 0) {
            return 0;
          }
          pcVar27 = ".lb8.ugrid64 failed";
          uVar19 = 0xb92;
LAB_0016cd19:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar19,"ref_gather_by_extension",(ulong)uVar8,pcVar27);
          return uVar8;
        }
      }
      iVar7 = strcmp(pcVar1 + -0xb,".b8.ugrid64");
      if (iVar7 == 0) {
        uVar8 = ref_gather_bin_ugrid(ref_grid,filename,1,1);
        if (uVar8 == 0) {
          return 0;
        }
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = ".b8.ugrid64 failed";
        uVar19 = 0xb98;
        goto LAB_0016cac6;
      }
    }
LAB_0016cf9e:
    iVar7 = strcmp(pcVar1 + -6,".meshb");
    if (iVar7 != 0) {
LAB_0016cfb5:
      printf("%s: %d: %s %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xba0,"output file name extension unknown",filename);
      return 1;
    }
    pRVar28 = ref_grid->node;
    pRVar3 = ref_grid->geom;
    uVar8 = ref_node_synchronize_globals(pRVar28);
    if (uVar8 != 0) {
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "sync";
      uVar19 = 0x8c5;
      goto LAB_0016d02e;
    }
    nedg._0_4_ = (ref_grid->twod == 0) + 2;
    mesh_units[0] = '\x02';
    mesh_units[1] = '\0';
    mesh_units[2] = '\0';
    mesh_units[3] = '\0';
    iVar7 = ref_grid->meshb_version;
    if ((ref_grid->meshb_version < 2) &&
       (iVar7 = mesh_units._0_4_, 10000000 < pRVar28->old_n_global)) {
      iVar7 = 4 - (uint)((ulong)pRVar28->old_n_global < 0xbebc201);
    }
    mesh_units._0_4_ = iVar7;
    uVar10 = mesh_units._0_4_;
    bVar30 = 3 < (uint)mesh_units._0_4_;
    local_188 = (void *)(ulong)bVar30;
    bVar31 = 2 < (uint)mesh_units._0_4_;
    local_c0 = (ulong)((uint)bVar30 * 4 + 4);
    local_b8 = (ulong)((uint)bVar30 * 4 + (uint)bVar31 * 4 + 0xc);
    if (ref_grid->mpi->id != 0) {
      pFVar12 = (FILE *)0x0;
      sVar11 = 0;
      RVar21 = mesh_units._0_4_;
      goto LAB_0016d364;
    }
    pFVar12 = fopen(filename,"w");
    if (pFVar12 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8de,"ref_gather_meshb","unable to open file");
      uStackY_1d0 = 2;
    }
    else {
      contact_info[0] = '\x01';
      contact_info[1] = '\0';
      contact_info[2] = '\0';
      contact_info[3] = '\0';
      sVar13 = fwrite(contact_info,4,1,pFVar12);
      if (sVar13 == 1) {
        sVar13 = fwrite(mesh_units,4,1,pFVar12);
        if (sVar13 != 1) {
          pcVar27 = "version";
          sVar11 = 1;
          uVar19 = 0x8e2;
          goto LAB_0016e1b3;
        }
        local_190 = pRVar28;
        lVar14 = ftell(pFVar12);
        ntri._0_4_ = 3;
        sVar13 = fwrite(&ntri,4,1,pFVar12);
        if (sVar13 != 1) {
          pcVar27 = "dim code";
          sVar11 = 1;
          uVar19 = 0x8e6;
          goto LAB_0016e1b3;
        }
        sVar11 = (ulong)((uint)bVar31 * 4 + 8) + lVar14 + 4;
        local_194._0_1_ = mesh_units[0];
        local_194._1_1_ = mesh_units[1];
        local_194._2_1_ = mesh_units[2];
        local_194._3_1_ = mesh_units[3];
        uVar8 = ref_export_meshb_next_position((FILE *)pFVar12,mesh_units._0_4_,sVar11);
        if (uVar8 != 0) {
          uStackY_1d0 = (ulong)uVar8;
          pcVar27 = "next p";
          uVar19 = 0x8e7;
LAB_0016d02e:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar19,"ref_gather_meshb",uStackY_1d0,pcVar27);
          goto LAB_0016d038;
        }
        sVar13 = fwrite(&nedg,4,1,pFVar12);
        if (sVar13 != 1) {
          pcVar27 = "dim";
          sVar11 = 1;
          uVar19 = 0x8e8;
          goto LAB_0016e1b3;
        }
        sVar13 = ftell(pFVar12);
        if (sVar11 != sVar13) {
          pcVar27 = "dim inconsistent";
          uVar19 = 0x8e9;
          goto LAB_0016e1b3;
        }
        pRVar28 = local_190;
        RVar21 = local_194;
        if (ref_grid->mpi->id != 0) {
LAB_0016d364:
          uVar8 = ref_gather_node(pRVar28,0,RVar21,ref_grid->twod,(FILE *)pFVar12);
          if (uVar8 != 0) {
            uStackY_1d0 = (ulong)uVar8;
            pcVar27 = "nodes";
            uVar19 = 0x8f9;
            goto LAB_0016d02e;
          }
          local_1a0 = pFVar12;
          local_194 = RVar21;
          if ((ref_grid->mpi->id != 0) || (sVar13 = ftell(pFVar12), sVar11 == sVar13)) {
            local_108 = CONCAT44(local_108._4_4_,3 - (uint)((uint)uVar10 < 4));
            uStackY_1d0 = 1;
            local_190 = pRVar28;
            for (file = (FILE *)0x2; file != (FILE *)0x12; file = (FILE *)((long)&file->_flags + 1))
            {
              pRVar4 = ref_grid->cell[(long)(file[-1]._unused2 + 0x12)];
              uVar8 = ref_cell_ncell(pRVar4,pRVar28,(REF_LONG *)&l2c);
              if (uVar8 != 0) {
                pcVar27 = "ncell";
                uVar19 = 0x8fe;
                goto LAB_0016e75d;
              }
              if (0 < (long)l2c) {
                if (ref_grid->mpi->id == 0) {
                  uVar8 = ref_cell_meshb_keyword(pRVar4,(REF_INT *)&ntri);
                  pFVar12 = local_1a0;
                  if (uVar8 != 0) {
                    pcVar27 = "kw";
                    uVar19 = 0x901;
                    goto LAB_0016e75d;
                  }
                  iVar7 = pRVar4->node_per;
                  lVar14 = ftell(local_1a0);
                  lVar22 = (long)(iVar7 + 1 << ((byte)local_108 & 0x1f)) * (long)l2c;
                  sVar13 = fwrite(&ntri,4,1,pFVar12);
                  RVar21 = local_194;
                  if (sVar13 == 1) {
                    sVar11 = lVar14 + local_b8 + lVar22;
                    uVar8 = ref_export_meshb_next_position((FILE *)local_1a0,local_194,sVar11);
                    if (uVar8 == 0) {
                      RVar9 = ref_gather_meshb_glob((FILE *)local_1a0,RVar21,(REF_GLOB)l2c);
                      pRVar28 = local_190;
                      if (RVar9 == 0) goto LAB_0016d5cd;
                      pcVar27 = "ncell";
                      uStackY_1d0 = 1;
                      uVar19 = 0x909;
                      goto LAB_0016d02e;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x908,"ref_gather_meshb",(ulong)uVar8,"next");
                    uStackY_1d0 = (ulong)uVar8;
                    goto LAB_0016d038;
                  }
                  pcVar27 = "keyword code";
                  sVar11 = 1;
                  uVar19 = 0x906;
                }
                else {
LAB_0016d5cd:
                  uVar8 = ref_gather_cell(pRVar28,pRVar4,0,1,0,(REF_BOOL)local_188,0,
                                          (REF_INT)local_1a0,length,file);
                  if (uVar8 != 0) {
                    pcVar27 = "nodes";
                    uVar19 = 0x90e;
                    goto LAB_0016e75d;
                  }
                  if ((ref_grid->mpi->id != 0) || (sVar13 = ftell(local_1a0), sVar11 == sVar13))
                  goto LAB_0016d616;
                  pcVar27 = "cell inconsistent";
                  uVar19 = 0x910;
                }
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar19,"ref_gather_meshb",pcVar27,sVar11,sVar13);
                goto LAB_0016d038;
              }
LAB_0016d616:
            }
            local_c0 = (ulong)(uint)((int)local_c0 * 2);
            uVar29 = 0;
            uStackY_1d0 = 2;
            local_108 = 1;
LAB_0016da33:
            pFVar12 = local_1a0;
            if (uVar29 == 3) goto LAB_0016e694;
            ntri._0_4_ = (uint)uVar29 | 0x28;
            uVar8 = ref_gather_ngeom(local_190,pRVar3,(uint)uVar29,(REF_INT *)&ntet);
            pFVar12 = local_1a0;
            if (uVar8 != 0) {
              pcVar27 = "ngeom";
              uVar19 = 0x916;
              goto LAB_0016e75d;
            }
            lVar14 = (long)(int)ntet;
            if (lVar14 < 1) goto LAB_0016dd57;
            if (ref_grid->mpi->id != 0) {
LAB_0016db1f:
              ref_mpi = local_190->ref_mpi;
              iVar7 = ref_mpi->id;
              pRVar32 = ref_mpi;
              if (iVar7 != 0) {
                uVar8 = pRVar3->max;
                goto LAB_0016db41;
              }
              pvVar15 = (void *)0x0;
              lVar14 = 0;
              local_c8 = sVar11;
LAB_0016dd7e:
              RVar21 = local_194;
              pFVar12 = local_1a0;
              uVar8 = pRVar3->max;
              if ((int)uVar8 <= lVar14) goto LAB_0016dec4;
              pRVar5 = pRVar3->descr;
              if (uVar29 != (uint)pRVar5[lVar14 * 6]) {
LAB_0016deb8:
                lVar14 = lVar14 + 1;
                pvVar15 = (void *)((long)pvVar15 + 0x10);
                goto LAB_0016dd7e;
              }
              iVar7 = pRVar5[lVar14 * 6 + 5];
              local_188 = pvVar15;
              if (ref_mpi->id != local_190->part[iVar7]) goto LAB_0016deb8;
              if ((iVar7 < 0) || (local_190->max <= iVar7)) {
                RVar20 = 0;
              }
              else {
                RVar20 = 0;
                if (-1 < local_190->global[iVar7]) {
                  RVar20 = local_190->global[iVar7] + 1;
                }
              }
              local_110 = (void *)CONCAT44(local_110._4_4_,pRVar5[lVar14 * 6 + 1]);
              nnode = (REF_GLOB)(double)pRVar5[lVar14 * 6 + 2];
              RVar9 = ref_gather_meshb_glob((FILE *)local_1a0,local_194,RVar20);
              if (RVar9 == 0) {
                RVar9 = ref_gather_meshb_int((FILE *)pFVar12,RVar21,(REF_INT)local_110);
                lVar22 = local_108;
                pvVar15 = local_188;
                ref_mpi = pRVar32;
                if (RVar9 != 0) {
                  pcVar27 = "id";
                  uVar19 = 0x865;
                  goto LAB_0016e894;
                }
                while (lVar22 = lVar22 + -1, lVar22 != 0) {
                  sVar11 = fwrite((void *)((long)pvVar15 + (long)pRVar3->param),8,1,local_1a0);
                  pvVar15 = (void *)((long)pvVar15 + 8);
                  if (sVar11 != 1) {
                    uVar19 = 0x86a;
                    goto LAB_0016e26f;
                  }
                }
                pvVar15 = local_188;
                pRVar32 = ref_mpi;
                if ((uVar29 != 0) &&
                   (sVar11 = fwrite(&nnode,8,1,local_1a0), pvVar15 = local_188, sVar11 != 1))
                goto LAB_0016ec5c;
                goto LAB_0016deb8;
              }
              pcVar27 = "node";
              uVar19 = 0x864;
LAB_0016e894:
              uStackY_1d0 = 1;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar19,"ref_gather_geom",1,pcVar27);
              goto LAB_0016e279;
            }
            uVar16 = (ulong)(uint)((int)ntet * 8);
            if (uVar29 == 0) {
              uVar16 = 0;
            }
            lVar22 = ftell(local_1a0);
            sVar13 = fwrite(&ntri,4,1,pFVar12);
            RVar21 = local_194;
            if (sVar13 != 1) {
              pcVar27 = "vertex version code";
              uStackY_1d0 = 1;
              uVar19 = 0x91e;
              sVar11 = uStackY_1d0;
              goto LAB_0016e1b3;
            }
            sVar11 = uVar16 + lVar22 + (local_c0 + uVar29 * 8) * lVar14 + local_b8;
            uVar8 = ref_export_meshb_next_position((FILE *)local_1a0,local_194,sVar11);
            if (uVar8 == 0) {
              RVar9 = ref_gather_meshb_int((FILE *)local_1a0,RVar21,(int)ntet);
              if (RVar9 != 0) {
                pcVar27 = "ngeom";
                uStackY_1d0 = 1;
                uVar19 = 0x920;
                goto LAB_0016d02e;
              }
              goto LAB_0016db1f;
            }
            pcVar27 = "np";
            uVar19 = 0x91f;
LAB_0016e75d:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar19,"ref_gather_meshb",(ulong)uVar8,pcVar27);
            uStackY_1d0 = (ulong)uVar8;
            goto LAB_0016d038;
          }
          pcVar27 = "vertex inconsistent";
          uVar19 = 0x8fb;
          goto LAB_0016e1b3;
        }
        lVar22 = (long)(int)nedg;
        uVar29 = local_c0 & 0xffffffff;
        lVar14 = local_190->old_n_global;
        lVar26 = ftell(pFVar12);
        ntri._0_4_ = 4;
        sVar13 = fwrite(&ntri,4,1,pFVar12);
        if (sVar13 != 1) {
          pcVar27 = "vertex version code";
          sVar11 = 1;
          uVar19 = 0x8f2;
          goto LAB_0016e1b3;
        }
        sVar11 = lVar26 + local_b8 + (uVar29 + lVar22 * 8) * lVar14;
        uVar8 = ref_export_meshb_next_position((FILE *)pFVar12,local_194,sVar11);
        pRVar28 = local_190;
        RVar21 = local_194;
        if (uVar8 != 0) {
          uStackY_1d0 = (ulong)uVar8;
          pcVar27 = "next p";
          uVar19 = 0x8f3;
          goto LAB_0016d02e;
        }
        uVar8 = ref_gather_meshb_glob((FILE *)pFVar12,local_194,local_190->old_n_global);
        if (uVar8 == 0) goto LAB_0016d364;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x8f5,"ref_gather_meshb",(ulong)uVar8,"nnode");
      }
      else {
        pcVar27 = "code";
        sVar11 = 1;
        uVar19 = 0x8e1;
LAB_0016e1b3:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar19,"ref_gather_meshb",pcVar27,sVar11,sVar13);
      }
      uStackY_1d0 = 1;
    }
LAB_0016d038:
    pcVar27 = "meshb failed";
    uVar19 = 0xb9d;
    goto LAB_0016cac6;
  }
  pFVar12 = (FILE *)ref_grid->mpi;
  pRVar28 = ref_grid->node;
  uVar8 = ref_node_synchronize_globals(pRVar28);
  if (uVar8 == 0) {
    RVar20 = pRVar28->old_n_global;
    uVar8 = ref_cell_ncell(ref_grid->cell[0],pRVar28,&nedg);
    if (uVar8 != 0) {
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "nedg";
      uVar19 = 0x94e;
      goto LAB_0016d09d;
    }
    local_1a0 = pFVar12;
    uVar8 = ref_cell_ncell(ref_grid->cell[3],pRVar28,&ntri);
    if (uVar8 != 0) {
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "ntri";
      uVar19 = 0x94f;
      goto LAB_0016d09d;
    }
    uVar8 = ref_cell_ncell(ref_grid->cell[8],pRVar28,&ntet);
    pFVar12 = local_1a0;
    if (uVar8 != 0) {
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "ntet";
      uVar19 = 0x950;
      goto LAB_0016d09d;
    }
    if (ref_grid->twod == 0) {
      uVar8 = ref_grid_faceid_range(ref_grid,&min_faceid,&max_faceid);
      pFVar12 = local_1a0;
      if (uVar8 == 0) goto LAB_0016d66c;
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "range";
      uVar19 = 0x956;
      goto LAB_0016d09d;
    }
    uVar8 = ref_cell_id_range(ref_grid->cell[0],(REF_MPI)local_1a0,&min_faceid,&max_faceid);
    if (uVar8 != 0) {
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "range";
      uVar19 = 0x954;
      goto LAB_0016d09d;
    }
LAB_0016d66c:
    if (*(int *)&pFVar12->field_0x4 != 0) {
      pFVar12 = (FILE *)0x0;
LAB_0016d679:
      uVar8 = ref_gather_node(pRVar28,0,0,0,(FILE *)pFVar12);
      if (uVar8 != 0) {
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = "nodes";
        uVar19 = 0xa75;
        goto LAB_0016d09d;
      }
      if (ref_grid->twod == 0) {
        pRVar4 = ref_grid->cell[3];
        for (iVar7 = 0; iVar7 < pRVar4->max; iVar7 = iVar7 + 1) {
          lVar14 = (long)iVar7 * (long)pRVar4->size_per;
          if (pRVar4->c2n[lVar14] != -1) {
            piVar2 = pRVar4->c2n + (long)(int)lVar14 + (long)pRVar4->node_per;
            *piVar2 = -*piVar2;
          }
        }
        iVar7 = 0;
        uVar8 = ref_gather_cell(pRVar28,pRVar4,0,1,0,0,0,(REF_INT)pFVar12,length,(FILE *)pFVar12);
        if (uVar8 == 0) {
          for (; iVar7 < pRVar4->max; iVar7 = iVar7 + 1) {
            lVar14 = (long)iVar7 * (long)pRVar4->size_per;
            if (pRVar4->c2n[lVar14] != -1) {
              piVar2 = pRVar4->c2n + (long)(int)lVar14 + (long)pRVar4->node_per;
              *piVar2 = -*piVar2;
            }
          }
          goto LAB_0016e3be;
        }
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = "nodes";
        uVar19 = 0xa9f;
        goto LAB_0016d09d;
      }
      pRVar4 = ref_grid->cell[0];
      for (iVar7 = 0; iVar7 < pRVar4->max; iVar7 = iVar7 + 1) {
        lVar14 = (long)iVar7 * (long)pRVar4->size_per;
        if (pRVar4->c2n[lVar14] != -1) {
          piVar2 = pRVar4->c2n + (long)(int)lVar14 + (long)pRVar4->node_per;
          *piVar2 = -*piVar2;
        }
      }
      iVar7 = 0;
      uVar8 = ref_gather_cell(pRVar28,pRVar4,0,1,0,0,1,(REF_INT)pFVar12,length,(FILE *)pFVar12);
      if (uVar8 != 0) {
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = "nodes";
        uVar19 = 0xa89;
        goto LAB_0016d09d;
      }
      for (; iVar7 < pRVar4->max; iVar7 = iVar7 + 1) {
        lVar14 = (long)iVar7 * (long)pRVar4->size_per;
        if (pRVar4->c2n[lVar14] != -1) {
          piVar2 = pRVar4->c2n + (long)(int)lVar14 + (long)pRVar4->node_per;
          *piVar2 = -*piVar2;
        }
      }
LAB_0016e3be:
      if (ref_grid->twod == 0) {
        uVar8 = ref_gather_cell(pRVar28,ref_grid->cell[8],0,0,0,0,0,(REF_INT)pFVar12,length,
                                (FILE *)pFVar12);
        if (uVar8 == 0) goto LAB_0016e64d;
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = "nodes";
        uVar19 = 0xacc;
        goto LAB_0016d09d;
      }
      pRVar4 = ref_grid->cell[3];
      for (iVar7 = 0; iVar7 < pRVar4->max; iVar7 = iVar7 + 1) {
        pRVar5 = pRVar4->c2n;
        lVar14 = (long)pRVar4->size_per * (long)iVar7;
        if (pRVar5[lVar14] != -1) {
          RVar21 = pRVar5[lVar14 + 2];
          pRVar5[lVar14 + 2] = pRVar5[lVar14 + 1];
          pRVar5[(long)pRVar4->size_per * (long)iVar7 + 1] = RVar21;
        }
      }
      iVar7 = 0;
      uVar8 = ref_gather_cell(pRVar28,pRVar4,0,0,0,0,1,(REF_INT)pFVar12,length,(FILE *)pFVar12);
      if (uVar8 != 0) {
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = "nodes";
        uVar19 = 0xab9;
        goto LAB_0016d09d;
      }
      for (; iVar7 < pRVar4->max; iVar7 = iVar7 + 1) {
        pRVar5 = pRVar4->c2n;
        lVar14 = (long)pRVar4->size_per * (long)iVar7;
        if (pRVar5[lVar14] != -1) {
          RVar21 = pRVar5[lVar14 + 2];
          pRVar5[lVar14 + 2] = pRVar5[lVar14 + 1];
          pRVar5[(long)pRVar4->size_per * (long)iVar7 + 1] = RVar21;
        }
      }
LAB_0016e64d:
      iVar7 = *(int *)&local_1a0->field_0x4;
joined_r0x0016d758:
      if (iVar7 != 0) {
        return 0;
      }
LAB_0016d75d:
      fclose(pFVar12);
      return 0;
    }
    iVar7 = max_faceid - min_faceid;
    builtin_strncpy(magic_string,"AVMESH",7);
    uStackY_1d0 = 1;
    uVar29 = uStackY_1d0;
    uStackY_1d0 = 1;
    n_meshes = 1;
    precision = 2;
    nul = '\0';
    builtin_strncpy(contact_info + 8,"ine",4);
    builtin_strncpy(contact_info,"NASA/ref",8);
    builtin_strncpy(file_description,"refine",7);
    builtin_strncpy(mesh_name,"Sketch2Solution",0x10);
    builtin_strncpy(mesh_type,"unstruc",8);
    builtin_strncpy(mesh_generator,"refine",7);
    ref_point_desc[0] = '\0';
    uStack_118 = 0x6e6f697475;
    l2c = (REF_GLOB *)0x6b53656e69666572;
    uStack_120 = 0x533268637465;
    uStack_11a = 0x6c6f;
    refined = 0;
    model_scale = 1.0;
    builtin_strncpy(element_scheme,"uniform",8);
    revision_number = precision;
    magic_number = n_meshes;
    pFVar12 = fopen(filename,"w");
    if (pFVar12 != (FILE *)0x0) {
      local_190 = (REF_NODE)CONCAT44(local_190._4_4_,iVar7);
      sVar11 = fwrite(magic_string,1,6,pFVar12);
      if (sVar11 == 6) {
        sVar11 = fwrite(&magic_number,4,1,pFVar12);
        if (sVar11 == 1) {
          sVar11 = fwrite(&revision_number,4,1,pFVar12);
          if (sVar11 == 1) {
            sVar11 = fwrite(&n_meshes,4,1,pFVar12);
            if (sVar11 == 1) {
              sVar11 = strlen(contact_info);
              length = (int)sVar11;
              sVar13 = (size_t)length;
              sVar11 = fwrite(contact_info,1,sVar13,pFVar12);
              if (sVar13 == sVar11) {
                local_190 = (REF_NODE)CONCAT44(local_190._4_4_,(int)local_190 + 1);
                length = 0x80 - length;
                iVar7 = -1;
                do {
                  iVar7 = iVar7 + 1;
                  if (length <= iVar7) {
                    sVar11 = fwrite(&precision,4,1,pFVar12);
                    if (sVar11 != 1) {
                      pcVar27 = "precision";
                      sVar13 = 1;
                      uVar19 = 0x984;
                      goto LAB_0016e8cb;
                    }
                    dimension = (ref_grid->twod == 0) + 2;
                    sVar11 = fwrite(&dimension,4,1,pFVar12);
                    if (sVar11 != 1) {
                      pcVar27 = "dimension";
                      sVar13 = 1;
                      uVar19 = 0x986;
                      goto LAB_0016e8cb;
                    }
                    sVar11 = strlen(file_description);
                    length = (int)sVar11;
                    sVar11 = fwrite(&length,4,1,pFVar12);
                    if (sVar11 != 1) {
                      pcVar27 = "length";
                      sVar13 = 1;
                      uVar19 = 0x988;
                      goto LAB_0016e8cb;
                    }
                    sVar13 = (size_t)length;
                    sVar11 = fwrite(file_description,1,sVar13,pFVar12);
                    if (sVar11 != sVar13) {
                      pcVar27 = "file_description";
                      uVar19 = 0x98b;
                      goto LAB_0016e8cb;
                    }
                    sVar11 = strlen(mesh_name);
                    length = (int)sVar11;
                    sVar13 = (size_t)length;
                    sVar11 = fwrite(mesh_name,1,sVar13,pFVar12);
                    if (sVar13 == sVar11) {
                      length = 0x80 - length;
                      iVar7 = -1;
                      goto LAB_0016eba9;
                    }
                    pcVar27 = "mesh_name";
                    uVar19 = 0x98e;
                    goto LAB_0016e8cb;
                  }
                  sVar11 = fwrite(&nul,1,1,pFVar12);
                } while (sVar11 == 1);
                pcVar27 = "nul";
                uVar19 = 0x982;
                sVar13 = 1;
              }
              else {
                pcVar27 = "contact_info";
                uVar19 = 0x97f;
              }
            }
            else {
              pcVar27 = "n_meshes";
              sVar13 = 1;
              uVar19 = 0x97b;
            }
          }
          else {
            pcVar27 = "revision_number";
            sVar13 = 1;
            uVar19 = 0x97a;
          }
        }
        else {
          pcVar27 = "magic_number";
          sVar13 = 1;
          uVar19 = 0x978;
        }
      }
      else {
        pcVar27 = "magic_string";
        sVar13 = 6;
        uVar19 = 0x976;
      }
      goto LAB_0016e8cb;
    }
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x974,
           "ref_gather_avm","unable to open file");
    uStackY_1d0 = 2;
  }
  else {
    uStackY_1d0 = (ulong)uVar8;
    pcVar27 = "sync";
    uVar19 = 0x94b;
LAB_0016d09d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19
           ,"ref_gather_avm",uStackY_1d0,pcVar27);
  }
  goto LAB_0016d0a7;
LAB_0016e694:
  if (ref_grid->mpi->id != 0) {
    return 0;
  }
  RVar6 = pRVar3->cad_data_size;
  if (RVar6 == 0) {
LAB_0016ee8e:
    ntri._0_4_ = 0x36;
    sVar13 = fwrite(&ntri,4,1,local_1a0);
    if (sVar13 == 1) {
      uVar8 = ref_export_meshb_next_position((FILE *)local_1a0,local_194,0);
      pFVar12 = local_1a0;
      if (uVar8 == 0) goto LAB_0016d75d;
      uStackY_1d0 = (ulong)uVar8;
      pcVar27 = "next p";
      uVar19 = 0x93b;
      goto LAB_0016d02e;
    }
    pcVar27 = "vertex version code";
    uVar19 = 0x939;
    sVar11 = 1;
  }
  else {
    ntri._0_4_ = 0x7e;
    lVar14 = ftell(local_1a0);
    sVar13 = fwrite(&ntri,4,1,pFVar12);
    if (sVar13 == 1) {
      next_position = RVar6 + local_b8 + lVar14;
      uVar8 = ref_export_meshb_next_position((FILE *)local_1a0,local_194,next_position);
      if (uVar8 == 0) {
        if (local_194 < 4) {
          uVar10 = (undefined4)pRVar3->cad_data_size;
          mesh_name[0] = (char)uVar10;
          mesh_name[1] = (char)((uint)uVar10 >> 8);
          mesh_name[2] = (char)((uint)uVar10 >> 0x10);
          mesh_name[3] = (char)((uint)uVar10 >> 0x18);
          sVar11 = fwrite(mesh_name,4,1,local_1a0);
          if (sVar11 == 1) {
LAB_0016ee42:
            sVar11 = pRVar3->cad_data_size;
            sVar13 = fwrite(pRVar3->cad_data,1,sVar11,local_1a0);
            if (sVar11 == sVar13) {
              sVar13 = ftell(local_1a0);
              if (next_position == sVar13) {
                if (ref_grid->mpi->id != 0) {
                  return 0;
                }
                goto LAB_0016ee8e;
              }
              pcVar27 = "cad_model inconsistent";
              uVar19 = 0x934;
              sVar11 = next_position;
            }
            else {
              pcVar27 = "node";
              uVar19 = 0x933;
            }
            goto LAB_0016e1b3;
          }
          pcVar27 = "int value";
          uVar19 = 0x487;
        }
        else {
          nnode = pRVar3->cad_data_size;
          sVar11 = fwrite(&nnode,8,1,local_1a0);
          if (sVar11 == 1) goto LAB_0016ee42;
          pcVar27 = "long value";
          uVar19 = 0x48a;
        }
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar19,"ref_gather_meshb_size",pcVar27,1,sVar11);
        pcVar27 = "cad size";
        uStackY_1d0 = 1;
        uVar19 = 0x92f;
      }
      else {
        uStackY_1d0 = (ulong)uVar8;
        pcVar27 = "next p";
        uVar19 = 0x92d;
      }
      goto LAB_0016d02e;
    }
    pcVar27 = "keyword";
    sVar11 = 1;
    uVar19 = 0x92c;
  }
  goto LAB_0016e1b3;
LAB_0016dec4:
  iVar7 = ref_mpi->id;
  sVar11 = local_c8;
  if (iVar7 == 0) {
    local_188 = (void *)CONCAT44(local_188._4_4_,1);
    while (sVar11 = local_c8, (int)local_188 < pRVar32->n) {
      uVar8 = ref_mpi_gather_recv(pRVar32,mesh_name,1,1,(int)local_188);
      if (uVar8 != 0) {
        pcVar27 = "recv ngeom";
        uVar19 = 0x873;
        goto LAB_0016e9c5;
      }
      uVar10 = mesh_name._0_4_;
      if (0 < (int)mesh_name._0_4_) {
        iVar7 = mesh_name._0_4_ * 3;
        local_110 = malloc((mesh_name._0_8_ & 0xffffffff) * 0x18);
        if (local_110 == (void *)0x0) {
          pcVar27 = "malloc node_id of REF_GLOB NULL";
          uVar19 = 0x875;
          goto LAB_0016e91b;
        }
        pvVar15 = malloc((ulong)(uint)(uVar10 * 2) << 3);
        if (pvVar15 == (void *)0x0) {
          pcVar27 = "malloc param of REF_DBL NULL";
          uVar19 = 0x876;
          goto LAB_0016e91b;
        }
        uVar8 = ref_mpi_gather_recv(pRVar32,local_110,iVar7,2,(int)local_188);
        if (uVar8 != 0) {
          pcVar27 = "recv node_id";
          uVar19 = 0x879;
          goto LAB_0016e9c5;
        }
        uVar8 = ref_mpi_gather_recv(pRVar32,pvVar15,mesh_name._0_4_ * 2,3,(int)local_188);
        if (uVar8 != 0) {
          pcVar27 = "recv param";
          uVar19 = 0x87b;
          goto LAB_0016e9c5;
        }
        local_78 = pvVar15;
        for (lVar14 = 0; lVar14 < (int)mesh_name._0_4_; lVar14 = lVar14 + 1) {
          lVar22 = lVar14 * 0x18;
          uVar19 = *(undefined8 *)((long)local_110 + lVar22 + 8);
          nnode = (REF_GLOB)(double)*(long *)((long)local_110 + lVar22 + 0x10);
          RVar9 = ref_gather_meshb_glob
                            ((FILE *)local_1a0,local_194,*(long *)((long)local_110 + lVar22) + 1);
          if (RVar9 != 0) {
            pcVar27 = "node";
            uVar19 = 0x880;
            goto LAB_0016e894;
          }
          uVar8 = ref_gather_meshb_int((FILE *)local_1a0,local_194,(REF_INT)uVar19);
          __ptr = local_78;
          lVar22 = local_108;
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x881,"ref_gather_geom",(ulong)uVar8,"id");
            goto LAB_0016e276;
          }
          while (lVar22 = lVar22 + -1, lVar22 != 0) {
            sVar11 = fwrite(__ptr,8,1,local_1a0);
            __ptr = (void *)((long)__ptr + 8);
            if (sVar11 != 1) {
              uVar19 = 0x884;
              goto LAB_0016e26f;
            }
          }
          if ((uVar29 != 0) && (sVar11 = fwrite(&nnode,8,1,local_1a0), sVar11 != 1)) {
            uVar19 = 0x886;
            goto LAB_0016e26f;
          }
          local_78 = (void *)((long)local_78 + 0x10);
        }
        free(pvVar15);
        free(local_110);
      }
      local_188 = (void *)CONCAT44(local_188._4_4_,(int)local_188 + 1);
    }
LAB_0016dd3b:
    if ((ref_grid->mpi->id == 0) && (sVar13 = ftell(local_1a0), sVar11 != sVar13)) {
      pcVar27 = "geom inconsistent";
      uVar19 = 0x924;
      goto LAB_0016e1b3;
    }
LAB_0016dd57:
    uVar29 = uVar29 + 1;
    local_108 = local_108 + 1;
    goto LAB_0016da33;
  }
LAB_0016db41:
  mesh_name._0_8_ = mesh_name._0_8_ & 0xffffffff00000000;
  uVar18 = 0;
  uVar16 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar16 = uVar18;
  }
  iVar23 = 0;
  for (; uVar16 * 0x18 - uVar18 != 0; uVar18 = uVar18 + 0x18) {
    if ((uVar29 == *(uint *)((long)pRVar3->descr + uVar18)) &&
       (iVar7 == local_190->part[*(int *)((long)pRVar3->descr + uVar18 + 0x14)])) {
      iVar23 = iVar23 + 1;
      mesh_name._0_4_ = iVar23;
    }
  }
  uVar8 = ref_mpi_gather_send(ref_mpi,mesh_name,1,1);
  if (uVar8 == 0) {
    uVar10 = mesh_name._0_4_;
    if ((int)mesh_name._0_4_ < 1) goto LAB_0016dd3b;
    local_c8 = sVar11;
    local_188 = malloc((mesh_name._0_8_ & 0xffffffff) * 0x18);
    if (local_188 == (void *)0x0) {
      pcVar27 = "malloc node_id of REF_GLOB NULL";
      uVar19 = 0x896;
    }
    else {
      pvVar15 = malloc((ulong)(uint)(uVar10 * 2) * 8);
      if (pvVar15 != (void *)0x0) {
        for (uVar16 = 0; (uint)(uVar10 * 2) != uVar16; uVar16 = uVar16 + 1) {
          *(undefined8 *)((long)pvVar15 + uVar16 * 8) = 0;
        }
        mesh_name._0_8_ = mesh_name._0_8_ & 0xffffffff00000000;
        uVar18 = 0;
        uVar16 = (ulong)(uint)pRVar3->max;
        if (pRVar3->max < 1) {
          uVar16 = uVar18;
        }
        iVar7 = 0;
        lVar14 = -1;
        for (uVar24 = 0; uVar24 != uVar16; uVar24 = uVar24 + 1) {
          pRVar5 = pRVar3->descr;
          if (uVar29 == (uint)pRVar5[uVar24 * 6]) {
            iVar23 = pRVar5[uVar24 * 6 + 5];
            if (pRVar32->id == local_190->part[iVar23]) {
              lVar22 = lVar14;
              if (((-1 < iVar23) && (iVar23 < local_190->max)) &&
                 (lVar22 = local_190->global[iVar23], local_190->global[iVar23] < 0)) {
                lVar22 = lVar14;
              }
              lVar26 = (long)(iVar7 * 3);
              *(long *)((long)local_188 + lVar26 * 8) = lVar22;
              *(long *)((long)local_188 + lVar26 * 8 + 8) = (long)pRVar5[uVar24 * 6 + 1];
              *(long *)((long)local_188 + lVar26 * 8 + 0x10) = (long)pRVar5[uVar24 * 6 + 2];
              for (uVar25 = 0; uVar29 != uVar25; uVar25 = uVar25 + 1) {
                *(undefined8 *)((long)pvVar15 + uVar25 * 8 + (long)(iVar7 * 2) * 8) =
                     *(undefined8 *)((long)pRVar3->param + uVar25 * 8 + uVar18);
              }
              iVar7 = iVar7 + 1;
              mesh_name._0_4_ = iVar7;
            }
          }
          uVar18 = uVar18 + 0x10;
        }
        uVar8 = ref_mpi_gather_send(pRVar32,local_188,iVar7 * 3,2);
        if (uVar8 == 0) {
          uVar8 = ref_mpi_gather_send(pRVar32,pvVar15,mesh_name._0_4_ * 2,3);
          if (uVar8 == 0) {
            free(pvVar15);
            free(local_188);
            sVar11 = local_c8;
            goto LAB_0016dd3b;
          }
          pcVar27 = "send param";
          uVar19 = 0x8a8;
        }
        else {
          pcVar27 = "send node_id";
          uVar19 = 0x8a6;
        }
        goto LAB_0016e9c5;
      }
      pcVar27 = "malloc param of REF_DBL NULL";
      uVar19 = 0x897;
    }
LAB_0016e91b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19
           ,"ref_gather_geom",pcVar27);
  }
  else {
    pcVar27 = "send ngeom";
    uVar19 = 0x894;
LAB_0016e9c5:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19
           ,"ref_gather_geom",(ulong)uVar8,pcVar27);
    uStackY_1d0 = (ulong)uVar8;
  }
LAB_0016e279:
  pcVar27 = "nodes";
  uVar19 = 0x922;
  goto LAB_0016d02e;
LAB_0016ec5c:
  uVar19 = 0x86c;
LAB_0016e26f:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19,
         "ref_gather_geom","id",1,sVar11);
LAB_0016e276:
  uStackY_1d0 = 1;
  goto LAB_0016e279;
  while (sVar11 = fwrite(&nul,1,1,pFVar12), sVar11 == 1) {
LAB_0016eba9:
    iVar7 = iVar7 + 1;
    if (length <= iVar7) {
      sVar11 = strlen(mesh_type);
      length = (int)sVar11;
      sVar13 = (size_t)length;
      sVar11 = fwrite(mesh_type,1,sVar13,pFVar12);
      if (sVar13 == sVar11) {
        length = 0x80 - length;
        iVar7 = -1;
        goto LAB_0016f162;
      }
      pcVar27 = "mesh_type";
      uVar19 = 0x995;
      goto LAB_0016e8cb;
    }
  }
  pcVar27 = "nul";
  uStackY_1d0 = 1;
  uVar19 = 0x991;
  sVar13 = uStackY_1d0;
  goto LAB_0016e8cb;
  while (sVar11 = fwrite(&nul,1,1,pFVar12), sVar11 == 1) {
LAB_0016f162:
    iVar7 = iVar7 + 1;
    if (length <= iVar7) {
      sVar11 = strlen(mesh_generator);
      length = (int)sVar11;
      sVar13 = (size_t)length;
      sVar11 = fwrite(mesh_generator,1,sVar13,pFVar12);
      if (sVar13 == sVar11) {
        length = 0x80 - length;
        iVar7 = -1;
        goto LAB_0016f21f;
      }
      pcVar27 = "mesh_generator";
      uVar19 = 0x99d;
      goto LAB_0016e8cb;
    }
  }
  pcVar27 = "nul";
  sVar13 = 1;
  uVar19 = 0x998;
  goto LAB_0016e8cb;
  while (sVar11 = fwrite(&nul,1,1,pFVar12), sVar11 == 1) {
LAB_0016f21f:
    iVar7 = iVar7 + 1;
    if (length <= iVar7) {
      if (ref_grid->twod == 0) {
        if (((ref_grid->geom->model != (void *)0x0) &&
            (RVar9 = ref_egads_get_attribute
                               (ref_grid->geom,3,-1,"av:coordinate_system",(char **)&nnode),
            RVar9 == 0)) &&
           (uVar8 = ref_grid_parse_coordinate_system(ref_grid,(char *)nnode), uVar8 != 0)) {
          pcVar27 = "parse av coor sys";
          uVar19 = 0x9ad;
          goto LAB_0016f554;
        }
        switch(ref_grid->coordinate_system) {
        case REF_GRID_XBYRZU:
          builtin_strncpy(coordinate_system,"xByRzU",7);
          break;
        case REF_GRID_XBYUZL:
          goto switchD_0016f3ca_caseD_1;
        case REF_GRID_XFYRZD:
          builtin_strncpy(coordinate_system,"xFyRzD",7);
          break;
        case REF_GRID_COORDSYS_LAST:
          pcVar27 = "REF_GRID_COORDSYS_LAST";
          uVar19 = 0x9ba;
          goto LAB_0016f50c;
        }
      }
      else {
switchD_0016f3ca_caseD_1:
        builtin_strncpy(coordinate_system,"xByUzL",7);
      }
      sVar11 = strlen(coordinate_system);
      length = (int)sVar11;
      sVar13 = (size_t)length;
      sVar11 = fwrite(coordinate_system,1,sVar13,pFVar12);
      if (sVar13 == sVar11) {
        length = 0x80 - length;
        iVar7 = -1;
        goto LAB_0016f2f7;
      }
      pcVar27 = "coordinate_system";
      uVar19 = 0x9c0;
      goto LAB_0016e8cb;
    }
  }
  pcVar27 = "nul";
  sVar13 = 1;
  uVar19 = 0x9a0;
  goto LAB_0016e8cb;
LAB_0016f2f7:
  iVar7 = iVar7 + 1;
  if (iVar7 < length) goto code_r0x0016f305;
  sVar11 = fwrite(&model_scale,8,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "model_scale";
    sVar13 = 1;
    uVar19 = 0x9c5;
    goto LAB_0016e8cb;
  }
  if (((ref_grid->geom->model != (void *)0x0) &&
      (RVar9 = ref_egads_get_attribute(ref_grid->geom,3,-1,"av:mesh_units",(char **)&nnode),
      RVar9 == 0)) && (uVar8 = ref_grid_parse_unit(ref_grid,(char *)nnode), uVar8 != 0)) {
    pcVar27 = "parse unit";
    uVar19 = 0x9cd;
LAB_0016f554:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19
           ,"ref_gather_avm",(ulong)uVar8,pcVar27);
    uStackY_1d0 = (ulong)uVar8;
    goto LAB_0016d0a7;
  }
  switch(ref_grid->unit) {
  case REF_GRID_IN:
    mesh_units._0_4_ = (uint)(byte)mesh_units[3] << 0x18;
    mesh_units[0] = 'i';
    mesh_units[1] = 'n';
    break;
  case REF_GRID_FT:
    mesh_units._0_4_ = (uint)(byte)mesh_units[3] << 0x18;
    mesh_units[0] = 'f';
    mesh_units[1] = 't';
    break;
  case REF_GRID_M:
    mesh_units[0] = 'm';
    mesh_units[1] = '\0';
    break;
  case REF_GRID_CM:
    mesh_units._0_4_ = (uint)(byte)mesh_units[3] << 0x18;
    mesh_units[0] = 'c';
    mesh_units[1] = 'm';
    break;
  case REF_GRID_UNIT_LAST:
    pcVar27 = "REF_GRID_UNIT_LAST";
    uVar19 = 0x9dd;
LAB_0016f50c:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19
           ,"ref_gather_avm",pcVar27);
    goto LAB_0016d0a7;
  }
  sVar11 = strlen(mesh_units);
  length = (int)sVar11;
  sVar13 = (size_t)length;
  sVar11 = fwrite(mesh_units,1,sVar13,pFVar12);
  if (sVar13 == sVar11) {
    length = 0x80 - length;
    iVar7 = -1;
    goto LAB_0016f5d8;
  }
  pcVar27 = "mesh_units";
  uVar19 = 0x9e1;
  goto LAB_0016e8cb;
code_r0x0016f305:
  sVar11 = fwrite(&nul,1,1,pFVar12);
  if (sVar11 != 1) goto code_r0x0016f320;
  goto LAB_0016f2f7;
code_r0x0016f320:
  pcVar27 = "nul";
  sVar13 = 1;
  uVar19 = 0x9c3;
  goto LAB_0016e8cb;
code_r0x0016f5e2:
  sVar11 = fwrite(&nul,1,1,pFVar12);
  if (sVar11 != 1) goto code_r0x0016f5fd;
  goto LAB_0016f5d8;
code_r0x0016f5fd:
  pcVar27 = "nul";
  sVar13 = 1;
  uVar19 = 0x9e4;
  goto LAB_0016e8cb;
LAB_0016f5d8:
  iVar7 = iVar7 + 1;
  if (iVar7 < length) goto code_r0x0016f5e2;
  if (((ref_grid->geom->model != (void *)0x0) &&
      (RVar9 = ref_egads_get_real_attribute
                         (ref_grid->geom,3,-1,"av:reference",(REF_DBL **)&nnode,&length), RVar9 == 0
      )) && (length == 7)) {
    for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
      ref_grid->references[lVar14] = *(REF_DBL *)(nnode + lVar14 * 8);
    }
  }
  sVar11 = fwrite(ref_grid->references,8,7,pFVar12);
  if (sVar11 != 7) {
    pcVar27 = "reference";
    sVar13 = 7;
    uVar19 = 0x9f3;
    goto LAB_0016e8cb;
  }
  sVar11 = strlen(ref_point_desc);
  length = (int)sVar11;
  sVar13 = (size_t)length;
  sVar11 = fwrite(ref_point_desc,1,sVar13,pFVar12);
  if (sVar13 != sVar11) {
    pcVar27 = "ref_point_desc";
    uVar19 = 0x9f7;
    goto LAB_0016e8cb;
  }
  length = 0x80 - length;
  iVar7 = -1;
  while (iVar7 = iVar7 + 1, iVar7 < length) {
    sVar11 = fwrite(&nul,1,1,pFVar12);
    if (sVar11 != 1) {
      pcVar27 = "nul";
      sVar13 = 1;
      uVar19 = 0x9fa;
      goto LAB_0016e8cb;
    }
  }
  sVar11 = fwrite(&refined,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "refined";
    sVar13 = 1;
    uVar19 = 0x9fc;
    goto LAB_0016e8cb;
  }
  sVar11 = strlen((char *)&l2c);
  length = (int)sVar11;
  sVar13 = (size_t)length;
  sVar11 = fwrite(&l2c,1,sVar13,pFVar12);
  if (sVar13 != sVar11) {
    pcVar27 = "mesh_description";
    uVar19 = 0xa00;
    goto LAB_0016e8cb;
  }
  length = 0x80 - length;
  iVar7 = -1;
  while (iVar7 = iVar7 + 1, iVar7 < length) {
    sVar11 = fwrite(&nul,1,1,pFVar12);
    if (sVar11 != 1) {
      pcVar27 = "nul";
      sVar13 = 1;
      uVar19 = 0xa03;
      goto LAB_0016e8cb;
    }
  }
  local_1a4 = (int)RVar20;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "nodes";
    sVar13 = 1;
    uVar19 = 0xa06;
    goto LAB_0016e8cb;
  }
  if (ref_grid->twod == 0) {
    local_1a4 = (int)ntet * 4 + (uint)ntri;
  }
  else {
    local_1a4 = (uint)ntri * 3 + (int)nedg;
  }
  local_1a4 = local_1a4 / 2;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "nfaces";
    sVar13 = 1;
    uVar19 = 0xa0c;
    goto LAB_0016e8cb;
  }
  pRVar17 = &ntri;
  if (ref_grid->twod == 0) {
    pRVar17 = &ntet;
  }
  local_1a4 = (int)*pRVar17;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "ncells";
    sVar13 = 1;
    uVar19 = 0xa12;
    goto LAB_0016e8cb;
  }
  if (ref_grid->twod == 0) {
    local_1a4 = 3;
    sVar11 = fwrite(&local_1a4,4,1,pFVar12);
    if (sVar11 == 1) {
      local_1a4 = 4;
      sVar11 = fwrite(&local_1a4,4,1,pFVar12);
      if (sVar11 == 1) {
        local_1a4 = 4;
        sVar11 = fwrite(&local_1a4,4,1,pFVar12);
        if (sVar11 == 1) goto LAB_0016fb4b;
        pcVar27 = "max faces per cell";
        sVar13 = 1;
        uVar19 = 0xa20;
      }
      else {
        pcVar27 = "max nodes per cell";
        sVar13 = 1;
        uVar19 = 0xa1e;
      }
    }
    else {
      pcVar27 = "max nodes per face";
      sVar13 = 1;
      uVar19 = 0xa1c;
    }
    goto LAB_0016e8cb;
  }
  local_1a4 = 2;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "max nodes per face";
    sVar13 = 1;
    uVar19 = 0xa15;
    goto LAB_0016e8cb;
  }
  local_1a4 = 3;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "max nodes per cell";
    sVar13 = 1;
    uVar19 = 0xa17;
    goto LAB_0016e8cb;
  }
  local_1a4 = 3;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "max faces per cell";
    sVar13 = 1;
    uVar19 = 0xa19;
    goto LAB_0016e8cb;
  }
LAB_0016fb4b:
  sVar11 = strlen(element_scheme);
  length = (int)sVar11;
  sVar13 = (size_t)length;
  sVar11 = fwrite(element_scheme,1,sVar13,pFVar12);
  if (sVar13 != sVar11) {
    pcVar27 = "element_scheme";
    uVar19 = 0xa25;
    goto LAB_0016e8cb;
  }
  length = 0x20 - length;
  iVar7 = -1;
  while (iVar7 = iVar7 + 1, iVar7 < length) {
    sVar11 = fwrite(&nul,1,1,pFVar12);
    if (sVar11 != 1) {
      pcVar27 = "nul";
      sVar13 = 1;
      uVar19 = 0xa28;
      goto LAB_0016e8cb;
    }
  }
  local_1a4 = 1;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "face polynomial order";
    sVar13 = 1;
    uVar19 = 0xa2b;
    goto LAB_0016e8cb;
  }
  local_1a4 = 1;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "cell polynomial order";
    sVar13 = 1;
    uVar19 = 0xa2d;
    goto LAB_0016e8cb;
  }
  local_1a4 = (int)local_190;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "# boundary patches";
    sVar13 = 1;
    uVar19 = 0xa2f;
    goto LAB_0016e8cb;
  }
  local_1a4 = 0;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "nhex";
    sVar13 = 1;
    uVar19 = 0xa31;
    goto LAB_0016e8cb;
  }
  pRVar17 = &ntet;
  if (ref_grid->twod != 0) {
    pRVar17 = &ntri;
  }
  local_1a4 = (int)*pRVar17;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "ntet";
    sVar13 = 1;
    uVar19 = 0xa37;
    goto LAB_0016e8cb;
  }
  local_1a4 = 0;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "npri";
    sVar13 = 1;
    uVar19 = 0xa39;
    goto LAB_0016e8cb;
  }
  local_1a4 = 0;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "npyr";
    sVar13 = 1;
    uVar19 = 0xa3b;
    goto LAB_0016e8cb;
  }
  pRVar17 = &nedg;
  if (ref_grid->twod == 0) {
    pRVar17 = &ntri;
  }
  local_1a4 = (int)*pRVar17;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "# boundary tri faces";
    sVar13 = 1;
    uVar19 = 0xa41;
    goto LAB_0016e8cb;
  }
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "# tri faces";
    sVar13 = 1;
    uVar19 = 0xa42;
    goto LAB_0016e8cb;
  }
  local_1a4 = 0;
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "# boundary quad faces";
    sVar13 = 1;
    uVar19 = 0xa44;
    goto LAB_0016e8cb;
  }
  sVar11 = fwrite(&local_1a4,4,1,pFVar12);
  if (sVar11 != 1) {
    pcVar27 = "# quad faces";
    sVar13 = 1;
    uVar19 = 0xa45;
    goto LAB_0016e8cb;
  }
  length = 5;
  iVar7 = -1;
  while (iVar7 = iVar7 + 1, iVar7 < length) {
    local_1a4 = 0;
    sVar11 = fwrite(&local_1a4,4,1,pFVar12);
    if (sVar11 != 1) {
      pcVar27 = "zeros";
      sVar13 = 1;
      uVar19 = 0xa49;
      goto LAB_0016e8cb;
    }
  }
  local_190 = (REF_NODE)CONCAT44(local_190._4_4_,min_faceid);
  while( true ) {
    if (max_faceid < (int)local_190) goto LAB_0016d679;
    pRVar3 = ref_grid->geom;
    iVar7 = (ref_grid->twod == 0) + 1;
    RVar9 = ref_egads_get_attribute(pRVar3,iVar7,(int)local_190,"av:patch_label",&patch_label);
    if (RVar9 != 0) {
      patch_label = "unknown";
    }
    snprintf((char *)&nnode,0x21,"%s-%d",patch_label,(ulong)local_190 & 0xffffffff);
    sVar11 = strlen((char *)&nnode);
    length = (int)sVar11;
    sVar13 = (size_t)length;
    sVar11 = fwrite(&nnode,1,sVar13,pFVar12);
    if (sVar13 != sVar11) break;
    length = 0x20 - length;
    iVar23 = -1;
    while (iVar23 = iVar23 + 1, iVar23 < length) {
      sVar11 = fwrite(&nul,1,1,pFVar12);
      if (sVar11 != 1) {
        pcVar27 = "nul";
        sVar13 = 1;
        uVar19 = 0xa5d;
        goto LAB_0016e8cb;
      }
    }
    RVar9 = ref_egads_get_attribute(pRVar3,iVar7,(int)local_190,"av:patch_type",&patch_type);
    if (patch_type == (char *)0x0 || RVar9 != 0) {
      patch_type = "unknown";
    }
    pcVar27 = patch_type;
    sVar11 = strlen(patch_type);
    length = (int)sVar11;
    sVar13 = (size_t)length;
    sVar11 = fwrite(pcVar27,1,sVar13,pFVar12);
    if (sVar13 != sVar11) {
      pcVar27 = "patch_label";
      uVar19 = 0xa66;
      goto LAB_0016e8cb;
    }
    length = 0x10 - length;
    iVar7 = -1;
    while (iVar7 = iVar7 + 1, iVar7 < length) {
      sVar11 = fwrite(&nul,1,1,pFVar12);
      if (sVar11 != 1) {
        pcVar27 = "nul";
        sVar13 = 1;
        uVar19 = 0xa69;
        goto LAB_0016e8cb;
      }
    }
    local_1a4 = -(int)local_190;
    sVar11 = fwrite(&local_1a4,4,1,pFVar12);
    if (sVar11 != 1) {
      pcVar27 = "patch ID";
      sVar13 = 1;
      uVar19 = 0xa6c;
      goto LAB_0016e8cb;
    }
    local_190 = (REF_NODE)CONCAT44(local_190._4_4_,(int)local_190 + 1);
  }
  pcVar27 = "patch_label";
  uVar19 = 0xa5a;
LAB_0016e8cb:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19,
         "ref_gather_avm",pcVar27,sVar13,sVar11);
  uStackY_1d0 = uVar29;
LAB_0016d0a7:
  pcVar27 = "scalar plt";
  uVar19 = 0xb6e;
LAB_0016cac6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar19,
         "ref_gather_by_extension",uStackY_1d0,pcVar27);
  return (REF_STATUS)uStackY_1d0;
}

Assistant:

REF_FCN REF_STATUS ref_gather_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 4 && (strcmp(&filename[end_of_string - 4], ".tec") == 0 ||
                            strcmp(&filename[end_of_string - 4], ".dat") == 0 ||
                            strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_tec(ref_grid, filename), "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".avm") == 0)) {
    RSS(ref_gather_avm(ref_grid, filename), "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 &&
      (strcmp(&filename[end_of_string - 4], ".plt") == 0)) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 0, NULL, NULL, filename),
        "scalar plt");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        ".lb8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        ".b8.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8l.ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        ".lb8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_gather_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        ".b8.ugrid64 failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_gather_meshb(ref_grid, filename), "meshb failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "output file name extension unknown", filename);
  return REF_FAILURE;
}